

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Cba_Man_t * Cba_ManCollapse(Cba_Man_t *p)

{
  char *pFileName;
  Hash_IntMan_t *vHash;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Cba_Man_t *p_00;
  Cba_Ntk_t *p_01;
  Vec_Int_t *vSigs;
  Cba_Ntk_t *pNtk;
  int *piVar5;
  int iVar6;
  int nFons;
  int nFins;
  int nObjs;
  
  pFileName = p->pSpec;
  pStrs = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = p->vHash;
  piVar5 = &vHash->nRefs;
  *piVar5 = *piVar5 + 1;
  p_00 = Cba_ManAlloc(pFileName,1,pStrs,pFuns,pMods,vHash);
  p_01 = Cba_ManRoot(p);
  vSigs = Vec_IntAlloc(1000);
  nObjs = 0;
  nFins = 0;
  nFons = 0;
  memcpy(p_00->pTypeNames,p->pTypeNames,0x2d0);
  Cba_ManGetClpStats(p,&nObjs,&nFins,&nFons);
  pNtk = Cba_NtkAlloc(p_00,p_01->NameId,(p_01->vInputs).nSize,(p_01->vOutputs).nSize,nObjs,nFins,
                      nFons);
  Cba_NtkAdd(p_00,pNtk);
  if (0 < (p_01->vObjName).nSize) {
    Cba_NtkCleanObjNames(pNtk);
  }
  if (0 < (p_01->vFonName).nSize) {
    Cba_NtkCleanFonNames(pNtk);
  }
  if (0 < (p_01->vObjAttr).nSize) {
    Vec_IntFill(&pNtk->vObjAttr,(pNtk->vObjType).nCap,0);
    Vec_IntFill(&pNtk->vAttrSto,1,-1);
  }
  iVar6 = 0;
  iVar1 = Cba_ObjAttr(p_01,0);
  if (iVar1 != 0) {
    piVar5 = Cba_ObjAttrArray(p_01,0);
    iVar1 = Cba_ObjAttrSize(p_01,0);
    Cba_ObjSetAttrs(pNtk,0,piVar5,iVar1);
  }
  Cba_NtkCleanObjCopies(p_01);
  for (; iVar1 = (p_01->vInputs).nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(&p_01->vInputs,iVar6);
    iVar2 = Cba_ObjFon0(p_01,iVar1);
    iVar3 = Cba_ObjDup(pNtk,p_01,iVar1);
    iVar4 = Cba_ObjFon0(pNtk,iVar3);
    Vec_IntPush(vSigs,iVar4);
    if (0 < (p_01->vObjName).nSize) {
      iVar4 = Cba_ObjName(p_01,iVar1);
      Cba_ObjSetName(pNtk,iVar3,iVar4);
    }
    if (0 < (p_01->vFonName).nSize) {
      iVar4 = Cba_ObjFon0(pNtk,iVar3);
      iVar2 = Cba_FonName(p_01,iVar2);
      Cba_FonSetName(pNtk,iVar4,iVar2);
    }
    iVar2 = Cba_ObjAttr(p_01,iVar1);
    if (iVar2 != 0) {
      piVar5 = Cba_ObjAttrArray(p_01,iVar1);
      iVar1 = Cba_ObjAttrSize(p_01,iVar1);
      Cba_ObjSetAttrs(pNtk,iVar3,piVar5,iVar1);
    }
  }
  if (vSigs->nSize != iVar1) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x331,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  Cba_NtkCollapse_rec(pNtk,p_01,vSigs);
  iVar1 = vSigs->nSize;
  if (iVar1 != (p_01->vOutputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x333,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(&p_01->vOutputs,iVar6);
    iVar2 = Cba_ObjFinFon(p_01,iVar1,0);
    iVar3 = Cba_ObjDup(pNtk,p_01,iVar1);
    iVar4 = Vec_IntEntry(vSigs,iVar6);
    Cba_ObjSetFinFon(pNtk,iVar3,0,iVar4);
    if (0 < (p_01->vObjName).nSize) {
      iVar4 = Cba_ObjName(p_01,iVar1);
      Cba_ObjSetName(pNtk,iVar3,iVar4);
    }
    if (0 < (p_01->vFonName).nSize) {
      iVar4 = Vec_IntEntry(vSigs,iVar6);
      iVar2 = Cba_FonName(p_01,iVar2);
      Cba_FonSetName(pNtk,iVar4,iVar2);
    }
    iVar2 = Cba_ObjAttr(p_01,iVar1);
    if (iVar2 != 0) {
      piVar5 = Cba_ObjAttrArray(p_01,iVar1);
      iVar1 = Cba_ObjAttrSize(p_01,iVar1);
      Cba_ObjSetAttrs(pNtk,iVar3,piVar5,iVar1);
    }
    iVar1 = (p_01->vOutputs).nSize;
  }
  Vec_IntFree(vSigs);
  if ((pNtk->vObjType).nSize == (pNtk->vObjType).nCap) {
    if ((pNtk->vFinFon).nSize != (pNtk->vFinFon).nCap) {
      __assert_fail("Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x341,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
    }
    if ((pNtk->vFonObj).nSize == (pNtk->vFonObj).nCap) {
      Cba_NtkMissingFonNames(pNtk,"m");
      return p_00;
    }
    __assert_fail("Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x342,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  __assert_fail("Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x340,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
}

Assistant:

Cba_Man_t * Cba_ManCollapse( Cba_Man_t * p )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    int i, iObj, iObjNew, iFon, nObjs = 0, nFins = 0, nFons = 0;
    Cba_ManDupTypeNames( pNew, p );
    Cba_ManGetClpStats( p, &nObjs, &nFins, &nFons    );
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Cba_NtkPiNum(pRoot), Cba_NtkPoNum(pRoot), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    if ( Cba_NtkHasObjAttrs(pRoot) )
        Cba_NtkCleanObjAttrs( pRootNew );
    if ( Cba_ObjAttr(pRoot, 0) )
        Cba_ObjSetAttrs( pRootNew, 0, Cba_ObjAttrArray(pRoot, 0), Cba_ObjAttrSize(pRoot, 0) );
    Cba_NtkCleanObjCopies( pRoot );
    Cba_NtkForEachPiFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Vec_IntPush( vSigs, Cba_ObjFon0(pRootNew, iObjNew) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Cba_ObjFon0(pRootNew, iObjNew), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot) );
    Cba_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot) );
    Cba_NtkForEachPoDriverFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Cba_ObjSetFinFon( pRootNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Vec_IntEntry(vSigs, i), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    Vec_IntFree( vSigs );
    assert( Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew) );
    assert( Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew) );
    assert( Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew) );
    // create internal node names
    Cba_NtkMissingFonNames( pRootNew, "m" );
    //Cba_NtkPrepareSeq( pRootNew );
    return pNew;
}